

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSimplexAnalysis.cpp
# Opt level: O3

void __thiscall HighsSimplexAnalysis::reportInvert(HighsSimplexAnalysis *this,bool header)

{
  undefined7 in_register_00000031;
  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  
  if ((int)CONCAT71(in_register_00000031,header) != 0) {
    return;
  }
  pbVar1 = (this->analysis_log)._M_t.
           super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           .
           super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
           ._M_head_impl + 0x10;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)pbVar1," ",1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)pbVar1,(this->rebuild_reason_string)._M_dataplus._M_p,
             (this->rebuild_reason_string)._M_string_length);
  return;
}

Assistant:

void HighsSimplexAnalysis::reportInvert(const bool header) {
  if (header) return;
  *analysis_log << " " << rebuild_reason_string;
}